

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O1

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitIf(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
        *this,IfExpr e)

{
  double dVar1;
  Buffer<char> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  ExprBase e_00;
  ulong uVar5;
  
  pBVar2 = this->writer_->buffer_;
  uVar5 = pBVar2->size_ + 3;
  if (pBVar2->capacity_ < uVar5) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar5);
  }
  pcVar3 = pBVar2->ptr_;
  sVar4 = pBVar2->size_;
  pcVar3[sVar4 + 2] = ' ';
  pcVar3 = pcVar3 + sVar4;
  pcVar3[0] = 'i';
  pcVar3[1] = 'f';
  pBVar2->size_ = uVar5;
  Visit(this,(LogicalExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_ +
             8))->impl_,0);
  pBVar2 = this->writer_->buffer_;
  uVar5 = pBVar2->size_ + 6;
  if (pBVar2->capacity_ < uVar5) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar5);
  }
  builtin_strncpy(pBVar2->ptr_ + pBVar2->size_," then ",6);
  pBVar2->size_ = uVar5;
  e_00.impl_ = ((ExprBase *)
               ((long)e.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_
               + 0x18))->impl_;
  if ((e_00.impl_)->kind_ == 1) {
    dVar1 = *(double *)(e_00.impl_ + 2);
    Visit(this,(NumericExpr)
               ((ExprBase *)
               ((long)e.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_
               + 0x10))->impl_,2 - (uint)(dVar1 == 0.0));
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      return;
    }
  }
  else {
    Visit(this,(NumericExpr)
               ((ExprBase *)
               ((long)e.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_
               + 0x10))->impl_,2);
  }
  pBVar2 = this->writer_->buffer_;
  uVar5 = pBVar2->size_ + 6;
  if (pBVar2->capacity_ < uVar5) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar5);
  }
  builtin_strncpy(pBVar2->ptr_ + pBVar2->size_," else ",6);
  pBVar2->size_ = uVar5;
  Visit(this,(NumericExpr)e_00.impl_,-1);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitIf(IfExpr e) {
  writer_ << "if ";
  Visit(e.condition(), prec::UNKNOWN);
  writer_ << " then ";
  NumericExpr else_expr = e.else_expr();
  bool has_else = !IsZero<ExprTypes>(else_expr);
  Visit(e.then_expr(), prec::CONDITIONAL + (has_else ? 1 : 0));
  if (has_else) {
    writer_ << " else ";
    Visit(else_expr);
  }
}